

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O3

void bfgs_iter_middle<sparse_parameters>
               (vw *all,bfgs *b,float *mem,double *rho,double *alpha,int *lastj,int *origin,
               sparse_parameters *weights)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  float fVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  float fVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  undefined8 *puVar13;
  int iVar14;
  _Hash_node_base *p_Var15;
  _Hash_node_base *p_Var16;
  uint uVar17;
  int iVar18;
  anon_union_4_2_947300a4 x;
  float fVar19;
  double dVar20;
  double dVar21;
  
  if (b->m != 0) {
    if (all->quiet == false) {
      bfgs_iter_middle<sparse_parameters>();
    }
    p_Var16 = (weights->_map)._M_h._M_before_begin._M_nxt;
    if (p_Var16 != (_Hash_node_base *)0x0) {
      iVar18 = b->mem_stride;
      iVar14 = *origin;
      dVar7 = 0.0;
      dVar8 = 0.0;
      dVar20 = 0.0;
      do {
        lVar10 = ((ulong)p_Var16[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) * (long)iVar18;
        mem[lVar10 + iVar14 % iVar18] =
             *(float *)((long)&(p_Var16[2]._M_nxt)->_M_nxt + 4) - mem[lVar10 + iVar14 % iVar18];
        lVar11 = (long)((*origin + 1) % b->mem_stride);
        mem[lVar10 + lVar11] = *(float *)&(p_Var16[2]._M_nxt)->_M_nxt - mem[lVar10 + lVar11];
        *(undefined4 *)&p_Var16[2]._M_nxt[1]._M_nxt =
             *(undefined4 *)((long)&(p_Var16[2]._M_nxt)->_M_nxt + 4);
        iVar14 = *origin;
        iVar18 = b->mem_stride;
        dVar21 = (double)mem[lVar10 + iVar14 % iVar18];
        p_Var15 = p_Var16 + 2;
        p_Var16 = p_Var16->_M_nxt;
        dVar7 = dVar7 + dVar21 * (double)mem[lVar10 + (iVar14 + 1) % iVar18];
        dVar8 = dVar8 + dVar21 * dVar21 * (double)*(float *)((long)&p_Var15->_M_nxt[1]._M_nxt + 4);
        dVar20 = dVar20 + (double)*(float *)((long)&p_Var15->_M_nxt->_M_nxt + 4) *
                          (double)mem[lVar10 + (iVar14 + 1) % iVar18];
      } while (p_Var16 != (_Hash_node_base *)0x0);
      if ((0.0 < dVar7) && (0.0 < dVar8)) {
        *rho = 1.0 / dVar7;
        lVar10 = (long)*lastj;
        if (0 < lVar10) {
          lVar11 = 0;
          do {
            alpha[lVar11] = dVar20 * rho[lVar11];
            p_Var16 = (weights->_map)._M_h._M_before_begin._M_nxt;
            if (p_Var16 == (_Hash_node_base *)0x0) {
              dVar20 = 0.0;
            }
            else {
              iVar18 = b->mem_stride;
              iVar14 = *origin;
              dVar20 = 0.0;
              do {
                lVar10 = ((ulong)p_Var16[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
                         (long)iVar18;
                *(float *)&p_Var16[2]._M_nxt[1]._M_nxt =
                     *(float *)&p_Var16[2]._M_nxt[1]._M_nxt -
                     (float)alpha[lVar11] * mem[lVar10 + (iVar14 + (int)lVar11 * 2) % iVar18];
                iVar14 = *origin;
                iVar18 = b->mem_stride;
                p_Var15 = p_Var16 + 2;
                p_Var16 = p_Var16->_M_nxt;
                dVar20 = dVar20 + (double)*(float *)&p_Var15->_M_nxt[1]._M_nxt *
                                  (double)mem[lVar10 + ((int)lVar11 * 2 + 3 + iVar14) % iVar18];
              } while (p_Var16 != (_Hash_node_base *)0x0);
            }
            lVar11 = lVar11 + 1;
            lVar10 = (long)*lastj;
          } while (lVar11 < lVar10);
        }
        alpha[lVar10] = dVar20 * rho[lVar10];
        p_Var16 = (weights->_map)._M_h._M_before_begin._M_nxt;
        uVar17 = *lastj;
        if (p_Var16 == (_Hash_node_base *)0x0) {
          dVar20 = 0.0;
        }
        else {
          iVar18 = b->mem_stride;
          iVar14 = *origin;
          dVar20 = 0.0;
          do {
            lVar10 = ((ulong)p_Var16[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
                     (long)iVar18;
            *(float *)&p_Var16[2]._M_nxt[1]._M_nxt =
                 *(float *)&p_Var16[2]._M_nxt[1]._M_nxt -
                 (float)alpha[(int)uVar17] * mem[lVar10 + (int)(iVar14 + uVar17 * 2) % iVar18];
            p_Var15 = p_Var16[2]._M_nxt;
            *(float *)&p_Var15[1]._M_nxt =
                 *(float *)((long)&p_Var15[1]._M_nxt + 4) * (float)(dVar7 / dVar8) *
                 *(float *)&p_Var15[1]._M_nxt;
            uVar17 = *lastj;
            iVar14 = *origin;
            iVar18 = b->mem_stride;
            p_Var15 = p_Var16 + 2;
            p_Var16 = p_Var16->_M_nxt;
            dVar20 = dVar20 + (double)*(float *)&p_Var15->_M_nxt[1]._M_nxt *
                              (double)mem[lVar10 + (int)(iVar14 + uVar17 * 2) % iVar18];
          } while (p_Var16 != (_Hash_node_base *)0x0);
        }
        if (0 < (int)uVar17) {
          uVar12 = (ulong)uVar17;
          do {
            p_Var16 = (weights->_map)._M_h._M_before_begin._M_nxt;
            if (p_Var16 == (_Hash_node_base *)0x0) {
              dVar20 = 0.0;
            }
            else {
              dVar7 = alpha[uVar12];
              dVar8 = dVar20 * rho[uVar12];
              iVar18 = b->mem_stride;
              iVar14 = *origin;
              dVar20 = 0.0;
              do {
                lVar10 = ((ulong)p_Var16[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
                         (long)iVar18;
                *(float *)&p_Var16[2]._M_nxt[1]._M_nxt =
                     mem[lVar10 + (iVar14 + (int)uVar12 * 2 + 1) % iVar18] * (float)(dVar7 - dVar8)
                     + *(float *)&p_Var16[2]._M_nxt[1]._M_nxt;
                iVar14 = *origin;
                iVar18 = b->mem_stride;
                p_Var15 = p_Var16 + 2;
                p_Var16 = p_Var16->_M_nxt;
                dVar20 = dVar20 + (double)*(float *)&p_Var15->_M_nxt[1]._M_nxt *
                                  (double)mem[lVar10 + ((int)uVar12 * 2 + -2 + iVar14) % iVar18];
              } while (p_Var16 != (_Hash_node_base *)0x0);
            }
            bVar6 = 1 < (long)uVar12;
            uVar12 = uVar12 - 1;
          } while (bVar6);
        }
        p_Var16 = (weights->_map)._M_h._M_before_begin._M_nxt;
        if (p_Var16 != (_Hash_node_base *)0x0) {
          dVar7 = *alpha;
          dVar8 = *rho;
          do {
            *(float *)&p_Var16[2]._M_nxt[1]._M_nxt =
                 mem[((ulong)p_Var16[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
                     (long)b->mem_stride + (long)((*origin + 1) % b->mem_stride)] *
                 -(float)(dVar7 - dVar20 * dVar8) - *(float *)&p_Var16[2]._M_nxt[1]._M_nxt;
            p_Var16 = p_Var16->_M_nxt;
          } while (p_Var16 != (_Hash_node_base *)0x0);
        }
        iVar14 = b->m + -1;
        iVar18 = *lastj + 1;
        if (iVar14 <= *lastj) {
          iVar18 = iVar14;
        }
        *lastj = iVar18;
        *origin = (*origin + b->mem_stride + -2) % b->mem_stride;
        for (p_Var16 = (weights->_map)._M_h._M_before_begin._M_nxt;
            p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
          lVar10 = ((ulong)p_Var16[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
                   (long)b->mem_stride;
          mem[lVar10 + *origin % b->mem_stride] = *(float *)((long)&(p_Var16[2]._M_nxt)->_M_nxt + 4)
          ;
          mem[lVar10 + (*origin + 1) % b->mem_stride] = *(float *)&(p_Var16[2]._M_nxt)->_M_nxt;
          *(undefined4 *)((long)&(p_Var16[2]._M_nxt)->_M_nxt + 4) = 0;
        }
        if ((long)*lastj < 1) {
          return;
        }
        uVar12 = (long)*lastj + 1;
        do {
          rho[uVar12 - 1] = rho[uVar12 - 2];
          uVar12 = uVar12 - 1;
        } while (1 < uVar12);
        return;
      }
    }
    puVar13 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar13 = &PTR__exception_002ddb38;
    __cxa_throw(puVar13,&curv_exception::typeinfo,std::exception::~exception);
  }
  p_Var16 = (weights->_map)._M_h._M_before_begin._M_nxt;
  if (p_Var16 == (_Hash_node_base *)0x0) {
    fVar19 = NAN;
LAB_001a9b68:
    if ((~(uint)fVar19 & 0x7fc00000) != 0) goto joined_r0x001a9b80;
  }
  else {
    fVar19 = 0.0;
    fVar9 = 0.0;
    p_Var15 = p_Var16;
    do {
      p_Var1 = p_Var15 + 1;
      p_Var2 = p_Var15 + 2;
      p_Var15 = p_Var15->_M_nxt;
      fVar3 = *(float *)((long)&p_Var2->_M_nxt->_M_nxt + 4);
      fVar4 = mem[(long)(*origin % b->mem_stride) +
                  ((ulong)p_Var1->_M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
                  (long)b->mem_stride];
      fVar5 = *(float *)((long)&p_Var2->_M_nxt[1]._M_nxt + 4);
      fVar19 = fVar19 + (fVar3 - fVar4) * fVar5 * fVar3;
      fVar9 = fVar9 + fVar4 * fVar5 * fVar4;
    } while (p_Var15 != (_Hash_node_base *)0x0);
    fVar19 = fVar19 / fVar9;
    if (0.0 <= fVar19) goto LAB_001a9b68;
  }
  fVar19 = 0.0;
joined_r0x001a9b80:
  for (; p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
    mem[((ulong)p_Var16[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) * (long)b->mem_stride +
        (long)(*origin % b->mem_stride)] = *(float *)((long)&(p_Var16[2]._M_nxt)->_M_nxt + 4);
    *(float *)&p_Var16[2]._M_nxt[1]._M_nxt = *(float *)&p_Var16[2]._M_nxt[1]._M_nxt * fVar19;
    p_Var15 = p_Var16[2]._M_nxt;
    *(float *)&p_Var15[1]._M_nxt =
         *(float *)&p_Var15[1]._M_nxt -
         *(float *)((long)&p_Var15[1]._M_nxt + 4) * *(float *)((long)&p_Var15->_M_nxt + 4);
    *(undefined4 *)((long)&(p_Var16[2]._M_nxt)->_M_nxt + 4) = 0;
  }
  if (all->quiet == false) {
    bfgs_iter_middle<sparse_parameters>();
  }
  return;
}

Assistant:

void bfgs_iter_middle(vw& all, bfgs& b, float* mem, double* rho, double* alpha, int& lastj, int& origin, T& weights)
{
  float* mem0 = mem;
  uint32_t length = 1 << all.num_bits;
  // implement conjugate gradient
  if (b.m == 0)
  {
    double g_Hy = 0.;
    double g_Hg = 0.;
    double y = 0.;

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      y = (&(*w))[W_GT] - mem[(MEM_GT + origin) % b.mem_stride];
      g_Hy += ((double)(&(*w))[W_GT]) * ((&(*w))[W_COND]) * y;
      g_Hg +=
          ((double)mem[(MEM_GT + origin) % b.mem_stride]) * ((&(*w))[W_COND]) * mem[(MEM_GT + origin) % b.mem_stride];
    }

    float beta = (float)(g_Hy / g_Hg);

    if (beta < 0.f || nanpattern(beta))
      beta = 0.f;

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      mem[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];

      (&(*w))[W_DIR] *= beta;
      (&(*w))[W_DIR] -= ((&(*w))[W_COND]) * ((&(*w))[W_GT]);
      (&(*w))[W_GT] = 0;
    }
    if (!all.quiet)
      fprintf(stderr, "%f\t", beta);
    return;

    mem = mem0 + (length - 1) * b.mem_stride;
  }
  else
  {
    if (!all.quiet)
      fprintf(stderr, "%-10s\t", "");
  }

  // implement bfgs
  double y_s = 0.;
  double y_Hy = 0.;
  double s_q = 0.;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    mem1[(MEM_YT + origin) % b.mem_stride] = (&(*w))[W_GT] - mem1[(MEM_GT + origin) % b.mem_stride];
    mem1[(MEM_ST + origin) % b.mem_stride] = (&(*w))[W_XT] - mem1[(MEM_XT + origin) % b.mem_stride];
    (&(*w))[W_DIR] = (&(*w))[W_GT];
    y_s += ((double)mem1[(MEM_YT + origin) % b.mem_stride]) * mem1[(MEM_ST + origin) % b.mem_stride];
    y_Hy +=
        ((double)mem1[(MEM_YT + origin) % b.mem_stride]) * mem1[(MEM_YT + origin) % b.mem_stride] * ((&(*w))[W_COND]);
    s_q += ((double)mem1[(MEM_ST + origin) % b.mem_stride]) * ((&(*w))[W_GT]);
  }

  if (y_s <= 0. || y_Hy <= 0.)
    throw curv_ex;
  rho[0] = 1 / y_s;

  float gamma = (float)(y_s / y_Hy);

  for (int j = 0; j < lastj; j++)
  {
    alpha[j] = rho[j] * s_q;
    s_q = 0.;
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      (&(*w))[W_DIR] -= (float)alpha[j] * mem[(2 * j + MEM_YT + origin) % b.mem_stride];
      s_q += ((double)mem[(2 * j + 2 + MEM_ST + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
    }
  }

  alpha[lastj] = rho[lastj] * s_q;
  double y_r = 0.;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    (&(*w))[W_DIR] -= (float)alpha[lastj] * mem[(2 * lastj + MEM_YT + origin) % b.mem_stride];
    (&(*w))[W_DIR] *= gamma * ((&(*w))[W_COND]);
    y_r += ((double)mem[(2 * lastj + MEM_YT + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
  }

  double coef_j;

  for (int j = lastj; j > 0; j--)
  {
    coef_j = alpha[j] - rho[j] * y_r;
    y_r = 0.;
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      (&(*w))[W_DIR] += (float)coef_j * mem[(2 * j + MEM_ST + origin) % b.mem_stride];
      y_r += ((double)mem[(2 * j - 2 + MEM_YT + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
    }
  }

  coef_j = alpha[0] - rho[0] * y_r;
  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    (&(*w))[W_DIR] = -(&(*w))[W_DIR] - (float)coef_j * mem[(MEM_ST + origin) % b.mem_stride];
  }

  /*********************
  ** shift
  ********************/

  lastj = (lastj < b.m - 1) ? lastj + 1 : b.m - 1;
  origin = (origin + b.mem_stride - 2) % b.mem_stride;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    mem[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];
    mem[(MEM_XT + origin) % b.mem_stride] = (&(*w))[W_XT];
    (&(*w))[W_GT] = 0;
  }
  for (int j = lastj; j > 0; j--) rho[j] = rho[j - 1];
}